

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestRspFileSuccess::Run(BuildTestRspFileSuccess *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  VirtualFileSystem *this_00;
  allocator<char> local_2b1;
  key_type local_2b0;
  allocator<char> local_289;
  key_type local_288;
  allocator<char> local_261;
  key_type local_260;
  allocator<char> local_239;
  key_type local_238;
  size_type local_218;
  size_t files_removed;
  size_t files_created;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  undefined4 local_1b8;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_190 [8];
  string err;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  BuildTestRspFileSuccess *pBStack_10;
  int fail_count;
  BuildTestRspFileSuccess *this_local;
  
  pBStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule cat_rsp\n  command = cat $rspfile > $out\n  rspfile = $rspfile\n  rspfile_content = $long_command\nrule cat_rsp_out\n  command = cat $rspfile > $out\n  rspfile = $out.rsp\n  rspfile_content = $long_command\nbuild out1: cat in\nbuild out2: cat_rsp in\n  rspfile = out 2.rsp\n  long_command = Some very long command\nbuild out$ 3: cat_rsp_out in\n  long_command = Some very long command\n"
              ,local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out1",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"out2",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"out 3",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Tick(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"in",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(this_00,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::string((string *)local_190);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"out1",&local_1b1);
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_1b0,(string *)local_190);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x668,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_190);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x669,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"out2",&local_1d9);
      pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_1d8,(string *)local_190);
      testing::Test::Check
                (pTVar1,pNVar5 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x66a,"builder_.AddTarget(\"out2\", &err)");
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      pTVar1 = g_current_test;
      bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_190);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x66b,"\"\" == err");
      pTVar1 = g_current_test;
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,"out 3",(allocator<char> *)((long)&files_created + 7));
        pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_200,(string *)local_190
                                   );
        testing::Test::Check
                  (pTVar1,pNVar5 != (Node *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x66c,"builder_.AddTarget(\"out 3\", &err)");
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator((allocator<char> *)((long)&files_created + 7));
        pTVar1 = g_current_test;
        bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_190);
        bVar3 = testing::Test::Check
                          (pTVar1,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x66d,"\"\" == err");
        if (bVar3) {
          files_removed =
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&(this->super_BuildTest).fs_.files_created_);
          local_218 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(&(this->super_BuildTest).fs_.files_removed_);
          pTVar1 = g_current_test;
          bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_190);
          testing::Test::Check
                    (pTVar1,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x672,"builder_.Build(&err)");
          pTVar1 = g_current_test;
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
          bVar3 = testing::Test::Check
                            (pTVar1,sVar6 == 3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x673,"3u == command_runner_.commands_ran_.size()");
          pTVar1 = g_current_test;
          if (bVar3) {
            sVar7 = files_removed + 2;
            sVar8 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&(this->super_BuildTest).fs_.files_created_);
            bVar3 = testing::Test::Check
                              (pTVar1,sVar7 == sVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x676,"files_created + 2 == fs_.files_created_.size()");
            pTVar1 = g_current_test;
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_238,"out 2.rsp",&local_239);
              sVar7 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&(this->super_BuildTest).fs_.files_created_,&local_238);
              bVar3 = testing::Test::Check
                                (pTVar1,sVar7 == 1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                 ,0x677,"1u == fs_.files_created_.count(\"out 2.rsp\")");
              std::__cxx11::string::~string((string *)&local_238);
              std::allocator<char>::~allocator(&local_239);
              pTVar1 = g_current_test;
              if (((bVar3 ^ 0xffU) & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_260,"out 3.rsp",&local_261);
                sVar7 = std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(&(this->super_BuildTest).fs_.files_created_,&local_260);
                bVar3 = testing::Test::Check
                                  (pTVar1,sVar7 == 1,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                   ,0x678,"1u == fs_.files_created_.count(\"out 3.rsp\")");
                std::__cxx11::string::~string((string *)&local_260);
                std::allocator<char>::~allocator(&local_261);
                pTVar1 = g_current_test;
                if (((bVar3 ^ 0xffU) & 1) == 0) {
                  sVar7 = local_218 + 2;
                  sVar8 = std::
                          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(&(this->super_BuildTest).fs_.files_removed_);
                  bVar3 = testing::Test::Check
                                    (pTVar1,sVar7 == sVar8,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                     ,0x67b,"files_removed + 2 == fs_.files_removed_.size()");
                  pTVar1 = g_current_test;
                  if (bVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_288,"out 2.rsp",&local_289);
                    sVar7 = std::
                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::count(&(this->super_BuildTest).fs_.files_removed_,&local_288);
                    bVar3 = testing::Test::Check
                                      (pTVar1,sVar7 == 1,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                       ,0x67c,"1u == fs_.files_removed_.count(\"out 2.rsp\")");
                    std::__cxx11::string::~string((string *)&local_288);
                    std::allocator<char>::~allocator(&local_289);
                    pTVar1 = g_current_test;
                    if (((bVar3 ^ 0xffU) & 1) == 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2b0,"out 3.rsp",&local_2b1);
                      sVar7 = std::
                              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::count(&(this->super_BuildTest).fs_.files_removed_,&local_2b0);
                      bVar3 = testing::Test::Check
                                        (pTVar1,sVar7 == 1,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                         ,0x67d,"1u == fs_.files_removed_.count(\"out 3.rsp\")");
                      std::__cxx11::string::~string((string *)&local_2b0);
                      std::allocator<char>::~allocator(&local_2b1);
                      if (((bVar3 ^ 0xffU) & 1) == 0) {
                        local_1b8 = 0;
                      }
                      else {
                        testing::Test::AddAssertionFailure(g_current_test);
                        local_1b8 = 1;
                      }
                    }
                    else {
                      testing::Test::AddAssertionFailure(g_current_test);
                      local_1b8 = 1;
                    }
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    local_1b8 = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  local_1b8 = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                local_1b8 = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              local_1b8 = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            local_1b8 = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_1b8 = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_1b8 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_1b8 = 1;
    }
    std::__cxx11::string::~string((string *)local_190);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildTest, RspFileSuccess)
{
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "rule cat_rsp\n"
    "  command = cat $rspfile > $out\n"
    "  rspfile = $rspfile\n"
    "  rspfile_content = $long_command\n"
    "rule cat_rsp_out\n"
    "  command = cat $rspfile > $out\n"
    "  rspfile = $out.rsp\n"
    "  rspfile_content = $long_command\n"
    "build out1: cat in\n"
    "build out2: cat_rsp in\n"
    "  rspfile = out 2.rsp\n"
    "  long_command = Some very long command\n"
    "build out$ 3: cat_rsp_out in\n"
    "  long_command = Some very long command\n"));

  fs_.Create("out1", "");
  fs_.Create("out2", "");
  fs_.Create("out 3", "");

  fs_.Tick();

  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AddTarget("out 3", &err));
  ASSERT_EQ("", err);

  size_t files_created = fs_.files_created_.size();
  size_t files_removed = fs_.files_removed_.size();

  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());

  // The RSP files were created
  ASSERT_EQ(files_created + 2, fs_.files_created_.size());
  ASSERT_EQ(1u, fs_.files_created_.count("out 2.rsp"));
  ASSERT_EQ(1u, fs_.files_created_.count("out 3.rsp"));

  // The RSP files were removed
  ASSERT_EQ(files_removed + 2, fs_.files_removed_.size());
  ASSERT_EQ(1u, fs_.files_removed_.count("out 2.rsp"));
  ASSERT_EQ(1u, fs_.files_removed_.count("out 3.rsp"));
}